

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O3

void Mop_ManPrintOne(Mop_Man_t *p,int iCube)

{
  word *pwVar1;
  word *pwVar2;
  uint uVar3;
  byte bVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar3 = p->nWordsIn * iCube;
  if ((-1 < (int)uVar3) && ((int)uVar3 < p->vWordsIn->nSize)) {
    uVar5 = iCube * p->nWordsOut;
    if ((-1 < (int)uVar5) && ((int)uVar5 < p->vWordsOut->nSize)) {
      pwVar1 = p->vWordsOut->pArray;
      if (0 < p->nIns) {
        pwVar2 = p->vWordsIn->pArray;
        bVar4 = 0;
        uVar7 = 0;
        do {
          putchar((int)(char)(&DAT_009993b0)
                             [(uint)(pwVar2[(ulong)uVar3 + (ulong)(uVar7 >> 5)] >> (bVar4 & 0x3e)) &
                              3]);
          uVar7 = uVar7 + 1;
          bVar4 = bVar4 + 2;
        } while ((int)uVar7 < p->nIns);
      }
      putchar(0x20);
      if (0 < p->nOuts) {
        uVar6 = 0;
        do {
          printf("%d",(ulong)((pwVar1[(ulong)uVar5 + (uVar6 >> 6)] >> (uVar6 & 0x3f) & 1) != 0));
          uVar3 = (int)uVar6 + 1;
          uVar6 = (ulong)uVar3;
        } while ((int)uVar3 < p->nOuts);
      }
      putchar(10);
      return;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
}

Assistant:

void Mop_ManPrintOne( Mop_Man_t * p, int iCube )
{
    int k;
    char Symb[4] = { '-', '0', '1', '?' };
    word * pCubeIn  = Mop_ManCubeIn( p, iCube );
    word * pCubeOut = Mop_ManCubeOut( p, iCube );
    for ( k = 0; k < p->nIns; k++ )
        printf( "%c", Symb[Abc_TtGetQua(pCubeIn, k)] );
    printf( " " );
    for ( k = 0; k < p->nOuts; k++ )
        printf( "%d", Abc_TtGetBit(pCubeOut, k) );
    printf( "\n" );
}